

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O1

attr * SEM_Exp(ast *node)

{
  uint uVar1;
  int iVar2;
  ast *paVar3;
  ast *paVar4;
  ast *node_00;
  attr *paVar5;
  basic_t *pbVar6;
  attr *paVar7;
  char *pcVar8;
  char *buf;
  size_t sVar9;
  arg_t *paVar10;
  size_t sVar11;
  char *pcVar12;
  int iVar13;
  field_t *pfVar14;
  char local_48 [24];
  
  do {
    paVar3 = child(node,1);
    paVar4 = child(node,2);
    node_00 = child(node,3);
    iVar2 = paVar3->type;
    uVar1 = iVar2 - 0x102;
    if (0x1a < uVar1) goto LAB_00105b08;
    node = paVar4;
  } while ((0x6080U >> (uVar1 & 0x1f) & 1) != 0);
  if ((3U >> (uVar1 & 0x1f) & 1) != 0) {
    paVar5 = (attr *)malloc(0x10);
    paVar5->kind = 0;
    pbVar6 = (basic_t *)malloc(0x10);
    (paVar5->field_1).basic = pbVar6;
    pbVar6->type = (uint)(iVar2 != 0x102) * 3 + 2;
    pbVar6->name = (char *)0x0;
    return paVar5;
  }
  if (uVar1 == 0x1a) {
    paVar5 = findvar(paVar3->val->typeval);
    if (node_00 == (ast *)0x0) {
      if (paVar5 != (attr *)0x0) {
        return paVar5;
      }
      iVar2 = paVar3->pos->first_line;
      pcVar12 = (char *)paVar3->val->numval;
      iVar13 = 1;
      pcVar8 = semErrorMsg[1];
    }
    else if (paVar5 == (attr *)0x0) {
      paVar5 = findfunc(paVar3->val->typeval);
      if (paVar5 != (attr *)0x0) {
        pcVar8 = (char *)malloc(0x100);
        buf = (char *)malloc(0x100);
        pcVar12 = paVar3->val->typeval;
        sVar9 = strlen(pcVar12);
        sprintf(pcVar8,"%s(",pcVar12);
        buf[0] = '(';
        buf[1] = '\0';
        paVar4 = sibling(paVar3,2);
        if (paVar4->type != 0x111) {
          for (paVar10 = SEM_Args(paVar4); paVar10 != (arg_t *)0x0; paVar10 = paVar10->next) {
            isFuncMatchCpStr(paVar10->arg,buf);
            sVar11 = strlen(buf);
            (buf + sVar11)[0] = ',';
            (buf + sVar11)[1] = ' ';
            buf[sVar11 + 2] = '\0';
          }
        }
        for (paVar10 = ((paVar5->field_1).function)->arg_list; paVar10 != (arg_t *)0x0;
            paVar10 = paVar10->next) {
          isFuncMatchCpStr(paVar10->arg,pcVar8);
          sVar11 = strlen(pcVar8);
          (pcVar8 + sVar11)[0] = ',';
          (pcVar8 + sVar11)[1] = ' ';
          pcVar8[sVar11 + 2] = '\0';
        }
        iVar2 = strcmp(pcVar8 + (int)sVar9,buf);
        if (iVar2 == 0) {
          free(pcVar8);
          free(buf);
        }
        else {
          sVar9 = strlen(pcVar8);
          sVar11 = strlen(buf);
          if (pcVar8[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] != '(') {
            pcVar8[(long)((sVar9 << 0x20) + -0x200000000) >> 0x20] = '\0';
          }
          if (buf[(long)((sVar11 << 0x20) + -0x100000000) >> 0x20] != '(') {
            buf[(long)((sVar11 << 0x20) + -0x200000000) >> 0x20] = '\0';
          }
          sVar9 = strlen(pcVar8);
          (pcVar8 + sVar9)[0] = ')';
          (pcVar8 + sVar9)[1] = '\0';
          sVar9 = strlen(buf);
          (buf + sVar9)[0] = ')';
          (buf + sVar9)[1] = '\0';
        }
        if (iVar2 == 0) {
          return paVar5;
        }
        semerror(9,paVar3->pos->first_line,semErrorMsg[9],pcVar8,buf);
        free(pcVar8);
        free(buf);
        return paVar5;
      }
      iVar2 = paVar3->pos->first_line;
      pcVar12 = (char *)paVar3->val->numval;
      iVar13 = 2;
      pcVar8 = semErrorMsg[2];
    }
    else {
      iVar2 = paVar3->pos->first_line;
      pcVar12 = (char *)paVar3->val->numval;
      iVar13 = 0xb;
      pcVar8 = semErrorMsg[0xb];
    }
LAB_00105f74:
    semerror(iVar13,iVar2,pcVar8,pcVar12);
  }
  else {
LAB_00105b08:
    if (iVar2 != -0x26fd) {
      abort();
    }
    paVar5 = SEM_Exp(paVar3);
    if (paVar5 == (attr *)0x0) {
      return (attr *)0x0;
    }
    if (paVar4->type == 0x10e) {
      if (paVar5->kind == 2) {
        pfVar14 = ((paVar5->field_1).structure)->field;
        if (pfVar14 != (field_t *)0x0) {
          pcVar12 = node_00->val->typeval;
          do {
            iVar2 = strcmp(pfVar14->name,pcVar12);
            if (iVar2 == 0) {
              return pfVar14->type;
            }
            pfVar14 = pfVar14->next;
          } while (pfVar14 != (field_t *)0x0);
        }
        iVar2 = node_00->pos->first_line;
        pcVar12 = (char *)node_00->val->numval;
        iVar13 = 0xe;
        pcVar8 = semErrorMsg[0xe];
        goto LAB_00105f74;
      }
      iVar2 = paVar4->pos->first_line;
      iVar13 = 0xd;
      pcVar12 = semErrorMsg[0xd];
    }
    else if (paVar4->type == 0x112) {
      if (paVar5->kind == 1) {
        paVar7 = SEM_Exp(node_00);
        if ((paVar7->kind == 0) && (((paVar7->field_1).basic)->type == 2)) {
          return (attr *)((paVar5->field_1).basic)->name;
        }
        paVar3 = child(node_00,1);
        if (paVar3->type == 0x103) {
          paVar3 = child(node_00,1);
          sprintf(local_48,"\"%lg\"",paVar3->val->numval);
        }
        else {
          builtin_strncpy(local_48,"Array argument",0xf);
        }
        iVar2 = node_00->pos->first_line;
        pcVar12 = local_48;
        iVar13 = 0xc;
        pcVar8 = semErrorMsg[0xc];
        goto LAB_00105f74;
      }
      iVar2 = paVar3->pos->first_line;
      iVar13 = 10;
      pcVar12 = semErrorMsg[10];
    }
    else {
      paVar7 = SEM_Exp(node_00);
      if (paVar4->type == 0x106) {
        if ((paVar5->kind == 3) ||
           ((paVar5->kind == 0 && (((paVar5->field_1).basic)->name == (char *)0x0)))) {
          iVar2 = paVar3->pos->first_line;
          iVar13 = 6;
          pcVar12 = semErrorMsg[6];
        }
        else {
          if (paVar7 == (attr *)0x0) {
            return paVar5;
          }
          iVar2 = isequal(paVar5,paVar7);
          if (iVar2 != 0) {
            return paVar5;
          }
          iVar2 = paVar4->pos->first_line;
          iVar13 = 5;
          pcVar12 = semErrorMsg[5];
        }
      }
      else {
        if (paVar7 == (attr *)0x0) {
          return paVar5;
        }
        iVar2 = isequal(paVar5,paVar7);
        if (iVar2 != 0) {
          return paVar5;
        }
        iVar2 = paVar4->pos->first_line;
        iVar13 = 7;
        pcVar12 = semErrorMsg[7];
      }
    }
    semerror(iVar13,iVar2,pcVar12);
  }
  return (attr *)0x0;
}

Assistant:

static struct attr* SEM_Exp(struct ast *node) {
    struct ast *child1 = child(node, 1);
    struct ast *child2 = child(node, 2);
    struct ast *child3 = child(node, 3);
    struct attr *a, *b;
    switch (child1->type) {
        case Exp:
            a = SEM_Exp(child1);
            if (a == NULL)
                return NULL;
            if (child2->type != LB && child2->type != DOT) {
                b = SEM_Exp(child3);
                if (child2->type == ASSIGNOP) {
                    if ((a->kind == BASIC && a->basic->name == NULL) || a->kind == FUNCTION) {
                        SEMERROR_NOVA(AssignLeftValue, child1);
                        return NULL;
                    } else if (b && !isequal(a, b)) { //error not match
//                    printf("error type not match\n");
                        SEMERROR_NOVA(AssignMismatch, child2);
                        return NULL;
                    }
                } else { //DONETODO: other types
                    if (b && !isequal(a, b)) { //error not match
//                    printf("error type not match\n");
                        SEMERROR_NOVA(OperandsMismatch, child2);
                        return NULL;
                    }
                }
                return a;
            }
            else if (child2->type == LB) {
                if (a->kind != ARRAY) { //DONETODO: error expected ARRAY
//                    printf("error expected ARRAY\n");
                    SEMERROR_NOVA(NotArray, child1);
                    return NULL;
                }
                b = SEM_Exp(child3);
                if (b->kind != BASIC || b->basic->type != INT_T) { //DONETODO: error expected int
//                    printf("error expected int\n");
                    char buf[24];
                    if (child(child3, 1)->type == FLOAT) {
                        sprintf(buf, "\"%lg\"", child(child3, 1)->val->fpval);
                    } else
                        strcpy(buf, "Array argument");
                    SEMERROR(NotInteger, child3, buf);
                    return NULL;
                }
                //UNKNOWNTODO: compose array type, REALLY NEED?
                return a->array->type;
            } else { // access struct field
                if (a->kind != STRUCTURE) { //DONETODO: error expected struct
//                    printf("error expected struct\n");
                    SEMERROR_NOVA(NotStruct, child2);
                    return NULL;
                }
                //DONETODO: search each field for ID
                struct field_t *structField = a->structure->field;
                for (; structField; structField = structField->next) {
                    if (strcmp(structField->name, child3->val->idval) == 0) {
                        break;
                    }
                }
                if (structField) {
                    return structField->type;
                } else {
                    SEMERROR(StructHasNoField, child3, child3->val->idval);
                    return NULL;
                }
            }
            break;
        case NOT:
        case MINUS:
            return SEM_Exp(child2);
        case ID:
            a = findvar(child1->val->idval);
            if (!child3) {
                if (a == NULL) { //DONETODO: error not found
                    //printf("error var not found: %s\n", child1->val->idval);
                    SEMERROR(UndefinedVariable, child1, child1->val->idval);
                }
                return a;
            }
            if (a) {
                SEMERROR(NotFunction, child1, child1->val->idval);
                return NULL;
            }
            a = findfunc(child1->val->idval);
            if (a == NULL) { //DONETODO: error func not decl
                //printf("error func not found: %s\n", child1->val->idval);
                SEMERROR(UndefinedFunction, child1, child1->val->idval);
                return a;
            }
            char *s1, *s2;
            if (!isFuncMatch(child1, a, &s1, &s2)) {
                //DONETODO check arg type
                SEMERROR(FunctionArgMismatch, child1, s1, s2);
                free(s1);
                free(s2);
//                return NULL;
            }
            return a;
        case INT:
        case FLOAT:
            a = malloc(sizeof(struct attr));
            a->kind = BASIC;
            a->basic = malloc(sizeof(struct basic_t));
            a->basic->type = child1->type == INT ? INT_T : FLOAT_T;
            a->basic->name = NULL;
            return a;
        case LP:
            return SEM_Exp(child2);
        default:
            break;
    }
    abort();
}